

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_outfit(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *pCVar6;
  OBJ_DATA *pOVar7;
  OBJ_INDEX_DATA *pOVar8;
  short *psVar9;
  int iVar10;
  char *txt;
  long lVar11;
  int vnum;
  int vnum_00;
  int vnum_01;
  ulong uVar12;
  AFFECT_DATA af;
  
  iVar4 = skill_lookup("outfit");
  bVar3 = is_affected(ch,iVar4);
  if (bVar3) {
    txt = "You have outfitted too recently and cannot do so again.\n\r";
LAB_002c425b:
    send_to_char(txt,ch);
    return;
  }
  if (0x19 < ch->level) {
    bVar3 = is_immortal(ch);
    if (!bVar3) {
      txt = "You are far too experienced to outfit yourself.\n\r";
      goto LAB_002c425b;
    }
  }
  pPVar2 = ch->pcdata;
  pPVar2->condition[2] = 1;
  pPVar2->condition[3] = 1;
  pCVar6 = char_data::Class(ch);
  iVar4 = CClass::GetIndex(pCVar6);
  vnum_01 = 0x6002;
  vnum_00 = 0x6000;
  iVar5 = 0x5ffe;
  iVar10 = 0x5ffc;
  vnum = 0x5ffa;
  if (iVar4 != 0xb) {
    pCVar6 = char_data::Class(ch);
    iVar4 = CClass::GetIndex(pCVar6);
    if (iVar4 != 10) {
      vnum_01 = 0x6003;
      vnum_00 = 0x6001;
      iVar5 = 0x5fff;
      iVar10 = 0x5ffd;
      vnum = 0x5ffb;
    }
  }
  pOVar7 = get_eq_char(ch,5);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar8 = get_obj_index(vnum);
    pOVar7 = create_object(pOVar8,0);
    pOVar7->cost = 0;
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,7);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar8 = get_obj_index(iVar5);
    pOVar7 = create_object(pOVar8,0);
    pOVar7->cost = 0;
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,8);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar8 = get_obj_index(vnum_01);
    pOVar7 = create_object(pOVar8,0);
    pOVar7->cost = 0;
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,9);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar8 = get_obj_index(vnum_00);
    pOVar7 = create_object(pOVar8,0);
    pOVar7->cost = 0;
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,10);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar8 = get_obj_index(iVar10);
    pOVar7 = create_object(pOVar8,0);
    pOVar7->cost = 0;
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,0x10);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    iVar10 = 0x600d;
    uVar12 = 0;
    iVar4 = 0;
    for (lVar11 = 8;
        *(long *)((long)weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar11 + -8) != 0;
        lVar11 = lVar11 + 0x18) {
      pCVar6 = char_data::Class(ch);
      iVar5 = CClass::GetIndex(pCVar6);
      pPVar2 = ch->pcdata;
      if ((iVar5 == 1) && (uVar12 == (uint)(int)pPVar2->start_weapon)) {
        psVar9 = &weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar12].vnum;
LAB_002c44eb:
        iVar10 = (int)*psVar9;
      }
      else {
        sVar1 = **(short **)
                  ((long)&(weapon_table.
                           super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                           super__Vector_impl_data._M_start)->vnum + lVar11);
        if (pPVar2->learned[iVar4] < pPVar2->learned[sVar1]) {
          psVar9 = (short *)((long)&(weapon_table.
                                     super__Vector_base<weapon_type,_std::allocator<weapon_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->name + lVar11);
          iVar4 = (int)sVar1;
          goto LAB_002c44eb;
        }
      }
      uVar12 = uVar12 + 1;
    }
    pOVar8 = get_obj_index(iVar10);
    pOVar7 = create_object(pOVar8,0);
    obj_to_char(pOVar7,ch);
    wear_obj(ch,pOVar7,false);
  }
  pOVar7 = get_eq_char(ch,0x10);
  if (pOVar7 != (OBJ_DATA *)0x0) {
    bVar3 = is_weapon_stat(pOVar7,5);
    if (bVar3) goto LAB_002c4597;
  }
  pOVar7 = get_eq_char(ch,0);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pOVar7 = get_eq_char(ch,0xb);
    if (pOVar7 == (OBJ_DATA *)0x0) {
      pOVar8 = get_obj_index(0x6004);
      pOVar7 = create_object(pOVar8,0);
      pOVar7->cost = 0;
      obj_to_char(pOVar7,ch);
      wear_obj(ch,pOVar7,false);
    }
  }
LAB_002c4597:
  pOVar8 = get_obj_index(0x137);
  pOVar7 = create_object(pOVar8,0);
  pOVar7->cost = 0;
  obj_to_char(pOVar7,ch);
  pOVar8 = get_obj_index(0xaea);
  pOVar7 = create_object(pOVar8,0);
  pOVar7->cost = 0;
  obj_to_char(pOVar7,ch);
  pOVar8 = get_obj_index(0x5fd6);
  pOVar7 = create_object(pOVar8,0);
  pOVar7->cost = 0;
  obj_to_char(pOVar7,ch);
  send_to_char("You have been equipped by the gods.\n\r",ch);
  init_affect(&af);
  af.where = 0;
  af.aftype = 2;
  iVar4 = skill_lookup("outfit");
  af.type = (short)iVar4;
  af.duration = 0x50;
  af.location = 0;
  af.bitvector[0]._3_1_ = af.bitvector[0]._3_1_ | 2;
  af.modifier = 0;
  af.level = ch->level;
  af.mod_name = 0x10;
  affect_to_char(ch,&af);
  return;
}

Assistant:

void do_outfit(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	int i, body, arms, legs, hands, feet, shield, sn, vnum;
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("outfit")))
	{
		send_to_char("You have outfitted too recently and cannot do so again.\n\r", ch);
		return;
	}

	if (ch->level > 25 && !is_immortal(ch))
	{
		send_to_char("You are far too experienced to outfit yourself.\n\r", ch);
		return;
	}

	ch->pcdata->condition[COND_THIRST] = 1;
	ch->pcdata->condition[COND_HUNGER] = 1;

	if (ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER)
	{
		body = 24570;
		arms = 24572;
		legs = 24574;
		hands = 24576;
		feet = 24578;
		shield = 24580;
	}
	else
	{
		body = 24571;
		arms = 24573;
		legs = 24575;
		hands = 24577;
		feet = 24579;
		shield = 24580;
	}

	obj = get_eq_char(ch, WEAR_BODY);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(body), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	/*
	obj = get_eq_char(ch, WEAR_HEAD);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3706), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_1);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_2);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	obj = get_eq_char(ch, WEAR_LEGS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(legs), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_FEET);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(feet), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_HANDS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(hands), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_ARMS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(arms), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	obj = get_eq_char(ch, WEAR_ABOUT);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3711), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WAIST);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3712), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_L);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_R);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	/* do the weapon thing*/
	obj = get_eq_char(ch, WEAR_WIELD);

	if (obj == nullptr)
	{
		sn = 0;
		vnum = OBJ_VNUM_SCHOOL_SWORD;

		for (i = 0; weapon_table[i].name != nullptr; i++)
		{
			if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->pcdata->start_weapon == i)
			{
				vnum = weapon_table[i].vnum;
			}
			else if (ch->pcdata->learned[sn] < ch->pcdata->learned[*weapon_table[i].gsn])
			{
				sn = *weapon_table[i].gsn;
				vnum = weapon_table[i].vnum;
			}
		}

		obj = create_object(get_obj_index(vnum), 0);
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if ((obj == nullptr || !is_weapon_stat(obj, WEAPON_TWO_HANDS))
		&& (obj = get_eq_char(ch, WEAR_LIGHT)) == nullptr
		&& (obj = get_eq_char(ch, WEAR_SHIELD)) == nullptr)
	{
		obj = create_object(get_obj_index(OBJ_VNUM_SCHOOL_SHIELD), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	for(i=24580; i < 24590; i++)
	{
		obj = create_object(get_obj_index(i), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
	}
	*/

	obj = create_object(get_obj_index(311), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(2794), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(24534), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	send_to_char("You have been equipped by the gods.\n\r", ch);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = skill_lookup("outfit");
	af.location = 0;
	af.duration = 80;

	SET_BIT(af.bitvector, AFF_DARK_VISION);

	af.modifier = 0;
	af.level = ch->level;
	af.mod_name = MOD_WARDROBE;
	affect_to_char(ch, &af);
}